

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::remove_peer_from_peers(raft_server *this,ptr<peer> *pp)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *this_00;
  long in_RDI;
  peer *in_stack_00000028;
  raft_server *in_stack_00000030;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  peer *in_stack_ffffffffffffffa0;
  string local_30 [48];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x476dfe);
    iVar2 = (**(code **)(*(long *)peVar4 + 0x38))();
    if (3 < iVar2) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x476e21);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x476e30);
      uVar3 = peer::get_id((peer *)0x476e38);
      msg_if_given_abi_cxx11_((char *)local_30,"server %d is removed from cluster",(ulong)uVar3);
      (**(code **)(*(long *)peVar4 + 0x40))
                (peVar4,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"remove_peer_from_peers",0x36a,local_30);
      std::__cxx11::string::~string(local_30);
    }
  }
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x476eb0
            );
  peer::enable_hb(in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffffa0);
  clear_snapshot_sync_ctx(in_stack_00000030,in_stack_00000028);
  this_00 = (unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
             *)(in_RDI + 0x1e0);
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x476eeb
            );
  peer::get_id((peer *)0x476ef3);
  std::
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  ::erase(this_00,(key_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  return;
}

Assistant:

void raft_server::remove_peer_from_peers(const ptr<peer>& pp) {
    p_in("server %d is removed from cluster", pp->get_id());
    pp->enable_hb(false);
    clear_snapshot_sync_ctx(*pp);
    peers_.erase(pp->get_id());
}